

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_tree_parse(mpack_tree_t *tree)

{
  byte bVar1;
  mpack_tree_page_t *pmVar2;
  char *__dest;
  mpack_node_data_t *node;
  size_t sVar3;
  _Bool _Var4;
  mpack_tree_page_t *pmVar5;
  size_t sVar6;
  size_t *psVar7;
  uint uVar8;
  anon_union_8_7_c87e5bf0_for_value aVar9;
  mpack_tree_parser_t parser;
  mpack_level_t stack_local [8];
  mpack_tree_parser_t local_e8;
  mpack_level_t local_a8 [8];
  
  if (tree->error != mpack_ok) {
    return;
  }
  tree->parsed = true;
  pmVar5 = tree->next;
  while (pmVar5 != (mpack_tree_page_t *)0x0) {
    pmVar2 = pmVar5->next;
    free(pmVar5);
    pmVar5 = pmVar2;
  }
  tree->next = (mpack_tree_page_t *)0x0;
  sVar6 = tree->size;
  if (sVar6 != 0) {
    __dest = tree->buffer;
    if (__dest == (char *)0x0) {
      tree->data = tree->data + sVar6;
    }
    else {
      memmove(__dest,__dest + sVar6,tree->data_length - sVar6);
    }
    tree->data_length = tree->data_length - tree->size;
    tree->size = 0;
  }
  local_e8.stack = (mpack_level_t *)0x0;
  local_e8._56_8_ = 0;
  local_e8.level = 0;
  local_e8.depth = 0;
  local_e8.nodes = (mpack_node_data_t *)0x0;
  local_e8.nodes_left = 0;
  local_e8.possible_nodes_left = tree->data_length;
  local_e8.tree = tree;
  if (tree->pool == (mpack_node_data_t *)0x0) {
    pmVar5 = (mpack_tree_page_t *)malloc(0xff8);
    if (pmVar5 == (mpack_tree_page_t *)0x0) {
      tree->error = mpack_error_memory;
    }
    else {
      pmVar5->next = (mpack_tree_page_t *)0x0;
      tree->next = pmVar5;
      local_e8.nodes = pmVar5->nodes;
      local_e8.nodes_left = 0xff;
      tree->root = local_e8.nodes;
    }
  }
  else {
    local_e8.nodes_left = tree->pool_count;
    local_e8.nodes = tree->pool;
  }
  if ((tree->error != mpack_ok) || (_Var4 = mpack_tree_reserve_bytes(&local_e8,1), !_Var4)) {
    return;
  }
  tree->root = local_e8.nodes;
  local_e8.nodes_left = local_e8.nodes_left - 1;
  tree->node_count = 1;
  local_e8._56_8_ = local_e8._56_8_ & 0xffffffffffffff00;
  local_e8.depth = 8;
  local_e8.stack = local_a8;
  local_e8.level = 0;
  local_a8[0].child = local_e8.nodes;
  local_a8[0].left = 1;
  local_e8.nodes = local_e8.nodes + 1;
  do {
    node = local_e8.stack[local_e8.level].child;
    local_e8.stack[local_e8.level].left = local_e8.stack[local_e8.level].left - 1;
    local_e8.stack[local_e8.level].child = node + 1;
    bVar1 = (local_e8.tree)->data[(local_e8.tree)->size];
    aVar9.i._1_7_ = 0;
    aVar9.b = (_Bool)bVar1;
    (local_e8.tree)->size = (local_e8.tree)->size + 1;
    switch(bVar1 >> 4) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
      node->type = mpack_type_uint;
      node->value = aVar9;
      break;
    case 8:
      node->type = mpack_type_map;
      goto LAB_00108f47;
    case 9:
      node->type = mpack_type_array;
LAB_00108f47:
      node->len = bVar1 & 0xf;
      mpack_tree_parse_children(&local_e8,node);
      break;
    case 10:
    case 0xb:
      node->type = mpack_type_str;
      uVar8 = bVar1 & 0x1f;
      node->len = uVar8;
      _Var4 = mpack_tree_reserve_bytes(&local_e8,(ulong)uVar8);
      if (_Var4) {
        node->value = (anon_union_8_7_c87e5bf0_for_value)(local_e8.tree)->size;
        (local_e8.tree)->size = (local_e8.tree)->size + (ulong)uVar8;
      }
      break;
    default:
      (*(code *)(&DAT_0010c814 + *(int *)(&DAT_0010c814 + (ulong)(bVar1 - 0xc0) * 4)))();
      return;
    case 0xe:
    case 0xf:
      node->type = mpack_type_int;
      node->value = (anon_union_8_7_c87e5bf0_for_value)(long)(char)bVar1;
    }
    if ((local_e8.tree)->error != mpack_ok) {
LAB_00109477:
      if (local_e8.stack_owned != true) {
        return;
      }
      free(local_e8.stack);
      return;
    }
    if (local_e8.stack[local_e8.level].left == 0) {
      psVar7 = &local_e8.stack[local_e8.level - 1].left;
      do {
        sVar6 = local_e8.level - 1;
        if (sVar6 == 0xffffffffffffffff) goto LAB_00109477;
        sVar3 = *psVar7;
        psVar7 = psVar7 + -2;
        local_e8.level = sVar6;
      } while (sVar3 == 0);
    }
  } while( true );
}

Assistant:

void mpack_tree_parse(mpack_tree_t* tree) {
    if (mpack_tree_error(tree) != mpack_ok)
        return;
    tree->parsed = true;

    mpack_tree_cleanup(tree);

    mpack_log("starting parse\n");

    // check if we previously parsed a tree
    if (tree->size > 0) {
        #ifdef MPACK_MALLOC
        // if we're buffered, move the remaining data back to the
        // start of the buffer
        // TODO: shrink buffer?
        if (tree->buffer != NULL) {
            mpack_memmove(tree->buffer, tree->buffer + tree->size, tree->data_length - tree->size);
        }
        else
        #endif
        // otherwise advance past the parsed data
        {
            tree->data += tree->size;
        }
        tree->data_length -= tree->size;
        tree->size = 0;
    }

    // setup parser
    mpack_tree_parser_t parser;
    mpack_tree_parser_setup(&parser, tree);
    if (mpack_tree_error(tree) != mpack_ok)
        return;

    // allocate the root node
    if (!mpack_tree_reserve_bytes(&parser, sizeof(uint8_t)))
        return;
    tree->root = parser.nodes;
    ++parser.nodes;
    --parser.nodes_left;
    tree->node_count = 1;

    // We read nodes in a loop instead of recursively for maximum
    // performance. The stack holds the amount of children left to
    // read in each level of the tree.

    // Even when we have a malloc() function, it's much faster to
    // allocate the initial parsing stack on the call stack. We
    // replace it with a heap allocation if we need to grow it.
    #ifdef MPACK_MALLOC
    #define MPACK_NODE_STACK_LOCAL_DEPTH MPACK_NODE_INITIAL_DEPTH
    parser.stack_owned = false;
    #else
    #define MPACK_NODE_STACK_LOCAL_DEPTH MPACK_NODE_MAX_DEPTH_WITHOUT_MALLOC
    #endif
    mpack_level_t stack_local[MPACK_NODE_STACK_LOCAL_DEPTH]; // no VLAs in VS 2013
    parser.depth = MPACK_NODE_STACK_LOCAL_DEPTH;
    parser.stack = stack_local;
    #undef MPACK_NODE_STACK_LOCAL_DEPTH
    parser.level = 0;
    parser.stack[0].child = tree->root;
    parser.stack[0].left = 1;

    mpack_tree_parse_elements(&parser);

    #ifdef MPACK_MALLOC
    if (parser.stack_owned)
        MPACK_FREE(parser.stack);
    #endif

    if (mpack_tree_error(tree) == mpack_ok) {
        mpack_log("parsed tree of %i bytes, %i bytes left\n", (int)tree->size, (int)parser.possible_nodes_left);
        mpack_log("%i nodes in final page\n", (int)parser.nodes_left);
    }
}